

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_test.cpp
# Opt level: O0

void sign_verifycase::test_method<picnic_params_t_const&>(anon_enum_32 *param)

{
  undefined1 auVar1 [64];
  bool bVar2;
  basic_wrap_stringstream<char> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  basic_wrap_stringstream<char> *msg;
  basic_wrap_stringstream<char> *this_00;
  basic_wrap_stringstream<char> *this_01;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *this_02;
  undefined1 auVar3 [64];
  sign_verifycase t;
  context_frame context_frame_240;
  lazy_ostream *in_stack_fffffffffffff598;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff5a0;
  std_string *in_stack_fffffffffffff5a8;
  basic_cstring<const_char> *in_stack_fffffffffffff5b0;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff5c0;
  const_string *in_stack_fffffffffffff5d8;
  size_t in_stack_fffffffffffff5e0;
  size_t line_num;
  const_string *in_stack_fffffffffffff5e8;
  unit_test_log_t *in_stack_fffffffffffff5f0;
  undefined1 local_988 [64];
  undefined1 local_948 [64];
  undefined1 local_908 [64];
  undefined1 local_8c8 [64];
  undefined1 local_888 [64];
  undefined1 auStack_848 [24];
  undefined1 local_830 [40];
  undefined1 auStack_808 [24];
  basic_cstring<const_char> local_7e0;
  undefined1 local_7c9;
  undefined1 local_7c8 [64];
  undefined1 local_788 [64];
  undefined1 local_748 [64];
  undefined1 local_708 [64];
  undefined1 local_6c8 [64];
  undefined1 auStack_688 [24];
  undefined1 local_670 [40];
  undefined1 auStack_648 [24];
  basic_cstring<const_char> local_620;
  undefined1 local_609;
  undefined1 local_608 [64];
  undefined1 local_5c8 [64];
  undefined1 local_588 [64];
  undefined1 local_548 [64];
  undefined1 local_508 [64];
  undefined1 auStack_4c8 [24];
  undefined1 local_4b0 [40];
  undefined1 auStack_488 [24];
  basic_cstring<const_char> local_460;
  undefined1 local_449;
  undefined1 local_448 [64];
  undefined1 local_408 [64];
  undefined1 local_3c8 [64];
  undefined1 local_388 [64];
  undefined1 local_348 [64];
  undefined1 auStack_308 [24];
  undefined1 local_2f0 [24];
  anon_enum_32 *param_00;
  sign_verifycase *this_03;
  basic_cstring<const_char> local_2a0;
  undefined1 local_289;
  undefined1 local_288 [64];
  undefined1 local_248 [64];
  undefined1 local_208 [64];
  undefined1 local_1c8 [64];
  undefined1 local_188 [64];
  undefined1 auStack_148 [24];
  undefined1 local_130 [40];
  undefined1 auStack_108 [24];
  basic_cstring<const_char> local_d8;
  anon_enum_32 *local_c8;
  context_frame local_c [3];
  
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_fffffffffffff5a8,(char (*) [1])in_stack_fffffffffffff5a0);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
             in_stack_fffffffffffff5a8,(char (*) [6])in_stack_fffffffffffff5a0);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[6],_const_char_(&)[6]>
              *)in_stack_fffffffffffff5a8,(char (*) [4])in_stack_fffffffffffff5a0);
  local_c8 = (anon_enum_32 *)
             boost::test_tools::tt_detail::print_helper<picnic_params_t>
                       ((anon_enum_32 *)in_stack_fffffffffffff598);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[6],_const_char_(&)[6]>,_char[4],_const_char_(&)[4]>
              *)in_stack_fffffffffffff5a8,
             (print_helper_t<picnic_params_t> *)in_stack_fffffffffffff5a0);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[6],_const_char_(&)[6]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>
              *)in_stack_fffffffffffff5a8,(char (*) [3])in_stack_fffffffffffff5a0);
  boost::test_tools::tt_detail::context_frame::context_frame
            ((context_frame *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[6],_const_char_(&)[6]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>,_char[3],_const_char_(&)[3]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[6],_const_char_(&)[6]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>,_char[3],_const_char_(&)[3]>
              *)0x1c05e7);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[6],_const_char_(&)[6]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[6],_const_char_(&)[6]>,_char[4],_const_char_(&)[4]>,_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>,_const_boost::test_tools::tt_detail::print_helper_t<picnic_params_t>_&>
              *)0x1c05f4);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[6],_const_char_(&)[6]>,_char[4],_const_char_(&)[4]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[6],_const_char_(&)[6]>,_char[4],_const_char_(&)[4]>
              *)0x1c0601);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[6],_const_char_(&)[6]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>,_char[6],_const_char_(&)[6]>
              *)0x1c060e);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
  ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                      *)0x1c061b);
  bVar2 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(local_c);
  if (bVar2) {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
               ,0x55);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_108 = auVar1._40_24_;
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_148 = auVar1._0_24_;
    local_130 = auVar1._24_40_;
    local_188 = vmovdqu64_avx512f(auVar3);
    local_1c8 = vmovdqu64_avx512f(auVar3);
    local_208 = vmovdqu64_avx512f(auVar3);
    local_248 = vmovdqu64_avx512f(auVar3);
    local_288 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff5a0);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_288);
    local_289 = 0x22;
    boost::operator<<(in_stack_fffffffffffff5a0,(char *)in_stack_fffffffffffff598);
    boost::operator<<(in_stack_fffffffffffff5a0,(char (*) [12])in_stack_fffffffffffff598);
    boost::operator<<(in_stack_fffffffffffff5a0,(char (*) [15])in_stack_fffffffffffff598);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff5c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,
               in_stack_fffffffffffff5d8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff5a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
               ,0x55);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    vmovdqu64_avx512f(auVar3);
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_308 = auVar1._0_24_;
    local_2f0 = auVar1._24_24_;
    param_00 = auVar1._48_8_;
    this_03 = auVar1._56_8_;
    local_348 = vmovdqu64_avx512f(auVar3);
    local_388 = vmovdqu64_avx512f(auVar3);
    local_3c8 = vmovdqu64_avx512f(auVar3);
    local_408 = vmovdqu64_avx512f(auVar3);
    local_448 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff5a0);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_448);
    local_449 = 0x22;
    boost::operator<<(in_stack_fffffffffffff5a0,(char *)in_stack_fffffffffffff598);
    boost::operator<<(in_stack_fffffffffffff5a0,(char (*) [12])in_stack_fffffffffffff598);
    boost::operator<<(in_stack_fffffffffffff5a0,(char (*) [16])in_stack_fffffffffffff598);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff5c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,
               in_stack_fffffffffffff5d8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff5a0);
    boost::unit_test::setup_conditional<sign_verifycase>
              ((sign_verifycase *)in_stack_fffffffffffff5a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_460,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
               ,0x55);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_488 = auVar1._40_24_;
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_4c8 = auVar1._0_24_;
    local_4b0 = auVar1._24_40_;
    local_508 = vmovdqu64_avx512f(auVar3);
    local_548 = vmovdqu64_avx512f(auVar3);
    local_588 = vmovdqu64_avx512f(auVar3);
    local_5c8 = vmovdqu64_avx512f(auVar3);
    local_608 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff5a0);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_608);
    local_609 = 0x22;
    boost::operator<<(in_stack_fffffffffffff5a0,(char *)in_stack_fffffffffffff598);
    boost::operator<<(in_stack_fffffffffffff5a0,(char (*) [12])in_stack_fffffffffffff598);
    this = boost::operator<<(in_stack_fffffffffffff5a0,(char (*) [13])in_stack_fffffffffffff598);
    file = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff5c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,(const_string *)file,in_stack_fffffffffffff5e0,
               in_stack_fffffffffffff5d8);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff5a0);
    _impl<picnic_params_t>(this_03,param_00);
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_620,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
               ,0x55);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_648 = auVar1._40_24_;
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_688 = auVar1._0_24_;
    local_670 = auVar1._24_40_;
    local_6c8 = vmovdqu64_avx512f(auVar3);
    local_708 = vmovdqu64_avx512f(auVar3);
    local_748 = vmovdqu64_avx512f(auVar3);
    local_788 = vmovdqu64_avx512f(auVar3);
    local_7c8 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff5a0);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_7c8);
    local_7c9 = 0x22;
    msg = boost::operator<<(in_stack_fffffffffffff5a0,(char *)in_stack_fffffffffffff598);
    boost::operator<<(in_stack_fffffffffffff5a0,(char (*) [12])in_stack_fffffffffffff598);
    boost::operator<<(in_stack_fffffffffffff5a0,(char (*) [19])in_stack_fffffffffffff598);
    this_00 = (basic_wrap_stringstream<char> *)
              boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff5c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,(const_string *)file,line_num,(const_string *)msg);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff5a0);
    boost::unit_test::teardown_conditional<sign_verifycase>
              ((sign_verifycase *)in_stack_fffffffffffff5a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
               ,0x55);
    auVar3 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_808 = auVar1._40_24_;
    auVar1 = vmovdqu64_avx512f(auVar3);
    auStack_848 = auVar1._0_24_;
    local_830 = auVar1._24_40_;
    local_888 = vmovdqu64_avx512f(auVar3);
    local_8c8 = vmovdqu64_avx512f(auVar3);
    local_908 = vmovdqu64_avx512f(auVar3);
    local_948 = vmovdqu64_avx512f(auVar3);
    local_988 = vmovdqu64_avx512f(auVar3);
    boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff5a0);
    boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_988);
    this_01 = boost::operator<<(in_stack_fffffffffffff5a0,(char *)in_stack_fffffffffffff598);
    s = boost::operator<<(in_stack_fffffffffffff5a0,(char (*) [12])in_stack_fffffffffffff598);
    this_02 = boost::operator<<(in_stack_fffffffffffff5a0,(char (*) [15])in_stack_fffffffffffff598);
    boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)this_01,(std_string *)s);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,(const_string *)file,line_num,(const_string *)msg);
    boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this_02);
  }
  boost::test_tools::tt_detail::context_frame::~context_frame((context_frame *)0x1c0e49);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(sign_verify, all_supported_parameters(), param) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(param)) {
    const size_t max_signature_size = picnic_signature_size(param);
    BOOST_TEST(max_signature_size);

    std::array<uint8_t, 32> m;
    randomize_container(m);

    // Create a key pair
    picnic_privatekey_t private_key;
    picnic_publickey_t public_key;
    BOOST_TEST(!picnic_keygen(param, &public_key, &private_key));

    // Valid key pair
    BOOST_TEST(picnic_get_public_key_param(&public_key) == param);
    BOOST_TEST(picnic_get_private_key_param(&private_key) == param);
    BOOST_TEST(!picnic_validate_keypair(&private_key, &public_key));

    std::vector<uint8_t> sig;
    sig.resize(max_signature_size);
    size_t siglen = max_signature_size;

    // Sign a message
    BOOST_TEST(!picnic_sign(&private_key, m.data(), m.size(), sig.data(), &siglen));
    BOOST_TEST(siglen > 0);
    BOOST_TEST(siglen <= max_signature_size);
    // Verify signature
    BOOST_TEST(!picnic_verify(&public_key, m.data(), m.size(), sig.data(), siglen));
  }
}